

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void * lua_touserdata(lua_State *L,int idx)

{
  TValue *pTVar1;
  int in_ESI;
  lua_State *in_RDI;
  StkId o;
  GCObject *local_8;
  
  pTVar1 = index2adr(in_RDI,in_ESI);
  if (pTVar1->tt == 2) {
    local_8 = (pTVar1->value).gc;
  }
  else if (pTVar1->tt == 7) {
    local_8 = (GCObject *)&(((pTVar1->value).gc)->h).lastfree;
  }
  else {
    local_8 = (GCObject *)0x0;
  }
  return local_8;
}

Assistant:

static void*lua_touserdata(lua_State*L,int idx){
StkId o=index2adr(L,idx);
switch(ttype(o)){
case 7:return(rawuvalue(o)+1);
case 2:return pvalue(o);
default:return NULL;
}
}